

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O3

JSValue js_std_file_close(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  FILE *__stream;
  uint uVar1;
  undefined8 *puVar2;
  int *piVar3;
  ulong uVar4;
  JSValue JVar5;
  
  puVar2 = (undefined8 *)JS_GetOpaque2(ctx,this_val,js_std_file_class_id);
  if (puVar2 == (undefined8 *)0x0) {
    JVar5 = (JSValue)(ZEXT816(6) << 0x40);
    uVar4 = 0;
  }
  else {
    __stream = (FILE *)*puVar2;
    if (__stream == (FILE *)0x0) {
      JVar5 = JS_ThrowTypeError(ctx,"invalid file handle");
      uVar4 = (ulong)JVar5.u.ptr & 0xffffffff00000000;
    }
    else {
      if (*(int *)((long)puVar2 + 0xc) == 0) {
        uVar1 = fclose(__stream);
      }
      else {
        uVar1 = pclose(__stream);
      }
      if (uVar1 == 0xffffffff) {
        piVar3 = __errno_location();
        uVar1 = -*piVar3;
      }
      *puVar2 = 0;
      uVar4 = 0;
      JVar5 = (JSValue)ZEXT416(uVar1);
    }
  }
  JVar5.u.ptr = (void *)(JVar5.u._0_4_ | uVar4);
  return JVar5;
}

Assistant:

static JSValue js_std_file_close(JSContext *ctx, JSValueConst this_val,
                                 int argc, JSValueConst *argv)
{
    JSSTDFile *s = JS_GetOpaque2(ctx, this_val, js_std_file_class_id);
    int err;
    if (!s)
        return JS_EXCEPTION;
    if (!s->f)
        return JS_ThrowTypeError(ctx, "invalid file handle");
    if (s->is_popen)
        err = js_get_errno(pclose(s->f));
    else
        err = js_get_errno(fclose(s->f));
    s->f = NULL;
    return JS_NewInt32(ctx, err);
}